

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O2

VOID GetSystemTimeAsFileTime(LPFILETIME lpSystemTimeAsFileTime)

{
  int iVar1;
  FILETIME FVar2;
  undefined1 local_30 [8];
  timeval Time;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      FVar2 = FILEUnixTimeToFileTime((time_t)local_30,Time.tv_sec * 1000);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","GetSystemTimeAsFileTime",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/filetime.cpp"
              ,0x204);
      fprintf(_stderr,"gettimeofday() failed");
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001265fd;
      FVar2.dwLowDateTime = 0xd53e8000;
      FVar2.dwHighDateTime = 0x19db1de;
    }
    lpSystemTimeAsFileTime->dwLowDateTime = FVar2.dwLowDateTime;
    lpSystemTimeAsFileTime->dwHighDateTime = FVar2.dwHighDateTime;
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
LAB_001265fd:
  abort();
}

Assistant:

VOID
PALAPI
GetSystemTimeAsFileTime(
            OUT LPFILETIME lpSystemTimeAsFileTime)
{
    struct timeval Time;

    PERF_ENTRY(GetSystemTimeAsFileTime);
    ENTRY("GetSystemTimeAsFileTime(lpSystemTimeAsFileTime=%p)\n", 
          lpSystemTimeAsFileTime);

    if ( gettimeofday( &Time, NULL ) != 0 )
    {
        ASSERT("gettimeofday() failed");
        /* no way to indicate failure, so set time to zero */
        *lpSystemTimeAsFileTime = FILEUnixTimeToFileTime( 0, 0 );
    }
    else
    {
        /* use (tv_usec * 1000) because 2nd arg is in nanoseconds */
        *lpSystemTimeAsFileTime = FILEUnixTimeToFileTime( Time.tv_sec,
                                                          Time.tv_usec * 1000 );
    }

    LOGEXIT("GetSystemTimeAsFileTime returns.\n");
    PERF_EXIT(GetSystemTimeAsFileTime);
}